

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

void cf_hmac_init(cf_hmac_ctx *ctx,cf_chash *hash,uint8_t *key,size_t nkey)

{
  size_t len;
  uint8_t k [128];
  uint8_t blk [128];
  
  if ((ctx != (cf_hmac_ctx *)0x0) && (hash != (cf_chash *)0x0)) {
    memset(ctx,0,0x2d8);
    ctx->hash = hash;
    len = hash->blocksz;
    if (len < nkey) {
      if (len < hash->hashsz) goto LAB_0010cc7a;
      cf_hash(hash,key,nkey,k);
      nkey = hash->hashsz;
      len = hash->blocksz;
    }
    else if (k != key) {
      memcpy(k,key,nkey);
    }
    if (nkey <= len && len - nkey != 0) {
      memset(k + nkey,0,len - nkey);
    }
    xor_b8(blk,k,'6',len);
    (*hash->init)(&ctx->inner);
    (*hash->update)(&ctx->inner,blk,hash->blocksz);
    xor_b8(blk,k,'\\',hash->blocksz);
    (*hash->init)(&ctx->outer);
    (*hash->update)(&ctx->outer,blk,hash->blocksz);
    return;
  }
LAB_0010cc7a:
  abort();
}

Assistant:

void cf_hmac_init(cf_hmac_ctx *ctx,
                  const cf_chash *hash,
                  const uint8_t *key, size_t nkey)
{
  assert(ctx);
  assert(hash);

  mem_clean(ctx, sizeof *ctx);
  ctx->hash = hash;

  /* Prepare key: */
  uint8_t k[CF_CHASH_MAXBLK];

  /* Shorten long keys. */
  if (nkey > hash->blocksz)
  {
    /* Standard doesn't cover case where blocksz < hashsz.
     * FIPS186-1 seems to want to append a negative number of zero bytes.
     * In any case, we only have a k buffer of CF_CHASH_MAXBLK! */
    assert(hash->hashsz <= hash->blocksz);

    cf_hash(hash, key, nkey, k);
    key = k;
    nkey = hash->hashsz;
  }

  /* Right zero-pad short keys. */
  if (k != key)
    memcpy(k, key, nkey);
  if (hash->blocksz > nkey)
    memset(k + nkey, 0, hash->blocksz - nkey);

  /* Start inner hash computation */
  uint8_t blk[CF_CHASH_MAXBLK];

  xor_b8(blk, k, 0x36, hash->blocksz);
  hash->init(&ctx->inner);
  hash->update(&ctx->inner, blk, hash->blocksz);

  /* And outer. */
  xor_b8(blk, k, 0x5c, hash->blocksz);
  hash->init(&ctx->outer);
  hash->update(&ctx->outer, blk, hash->blocksz);

  mem_clean(blk, sizeof blk);
  mem_clean(k, sizeof k);
}